

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserCtxtPtr
xmlCreateIOParserCtxt
          (xmlSAXHandlerPtr sax,void *user_data,xmlInputReadCallback ioread,
          xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr input;
  xmlParserInputPtr value;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr inputStream;
  xmlParserCtxtPtr ctxt;
  xmlCharEncoding enc_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  if (ioread == (xmlInputReadCallback)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    input = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,enc);
    if (input == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      sax_local = (xmlSAXHandlerPtr)xmlNewSAXParserCtxt(sax,user_data);
      if ((xmlParserCtxtPtr)sax_local == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(input);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
      else {
        value = xmlNewIOInputStream((xmlParserCtxtPtr)sax_local,input,enc);
        if (value == (xmlParserInputPtr)0x0) {
          xmlFreeParserCtxt((xmlParserCtxtPtr)sax_local);
          sax_local = (xmlSAXHandlerPtr)0x0;
        }
        else {
          inputPush((xmlParserCtxtPtr)sax_local,value);
        }
      }
    }
  }
  return (xmlParserCtxtPtr)sax_local;
}

Assistant:

xmlParserCtxtPtr
xmlCreateIOParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
	xmlInputReadCallback   ioread, xmlInputCloseCallback  ioclose,
	void *ioctx, xmlCharEncoding enc) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;

    if (ioread == NULL) return(NULL);

    buf = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx, enc);
    if (buf == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL) {
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }

    inputStream = xmlNewIOInputStream(ctxt, buf, enc);
    if (inputStream == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    inputPush(ctxt, inputStream);

    return(ctxt);
}